

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_bitmap_intersect(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  uint16_t x;
  ushort x_00;
  _Bool _Var1;
  byte bVar2;
  uint uVar3;
  uint pos;
  array_container_t *src_1;
  array_container_t *array2;
  int pos_00;
  ulong uVar4;
  array_container_t *paVar5;
  ulong uVar6;
  bool bVar7;
  byte local_42;
  byte local_41;
  int32_t local_40;
  int32_t local_3c;
  container_t *local_38;
  
  local_3c = (x1->high_low_container).size;
  local_40 = (x2->high_low_container).size;
  uVar4 = 0;
  pos = 0;
LAB_0011517a:
  uVar6 = uVar4 & 0xffff;
LAB_0011517e:
  pos_00 = (int)uVar4;
  bVar7 = (int)pos < local_3c && pos_00 < local_40;
  if ((int)pos >= local_3c || pos_00 >= local_40) {
    return bVar7;
  }
  uVar3 = pos & 0xffff;
  x = (x1->high_low_container).keys[uVar3];
  x_00 = (x2->high_low_container).keys[uVar6];
  if (x == x_00) {
    local_41 = (x1->high_low_container).typecodes[uVar3];
    local_42 = (x2->high_low_container).typecodes[uVar6];
    local_38 = (x2->high_low_container).containers[uVar6];
    src_1 = (array_container_t *)
            container_unwrap_shared((x1->high_low_container).containers[uVar3],&local_41);
    array2 = (array_container_t *)container_unwrap_shared(local_38,&local_42);
    switch((uint)local_42 + (uint)local_41 * 4) {
    case 5:
      _Var1 = bitset_container_intersect((bitset_container_t *)src_1,(bitset_container_t *)array2);
      break;
    case 6:
      paVar5 = src_1;
      goto LAB_001152a5;
    case 7:
      paVar5 = src_1;
      goto LAB_001152b2;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x139e,
                    "_Bool container_intersect(const container_t *, uint8_t, const container_t *, uint8_t)"
                   );
    case 9:
      paVar5 = array2;
      array2 = src_1;
LAB_001152a5:
      _Var1 = array_bitset_container_intersect(array2,(bitset_container_t *)paVar5);
      break;
    case 10:
      _Var1 = array_container_intersect(src_1,array2);
      break;
    case 0xb:
      paVar5 = array2;
      goto LAB_00115290;
    case 0xd:
      paVar5 = array2;
      array2 = src_1;
LAB_001152b2:
      _Var1 = run_bitset_container_intersect((run_container_t *)array2,(bitset_container_t *)paVar5)
      ;
      break;
    case 0xe:
      paVar5 = src_1;
      src_1 = array2;
LAB_00115290:
      _Var1 = array_run_container_intersect(src_1,(run_container_t *)paVar5);
      break;
    case 0xf:
      _Var1 = run_container_intersect((run_container_t *)src_1,(run_container_t *)array2);
    }
    bVar2 = _Var1 ^ 1;
    uVar4 = (ulong)(pos_00 + (uint)bVar2);
    pos = pos + bVar2;
    if (bVar2 == 0) {
      return bVar7;
    }
  }
  else {
    if (x < x_00) goto code_r0x001151bb;
    uVar3 = ra_advance_until(&x2->high_low_container,x,pos_00);
    uVar4 = (ulong)uVar3;
  }
  goto LAB_0011517a;
code_r0x001151bb:
  pos = ra_advance_until(&x1->high_low_container,x_00,pos);
  goto LAB_0011517e;
}

Assistant:

bool roaring_bitmap_intersect(const roaring_bitmap_t *x1,
                                     const roaring_bitmap_t *x2) {
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint64_t answer = 0;
    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(& x1->high_low_container, pos1);
        const uint16_t s2 = ra_get_key_at_index(& x2->high_low_container, pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            if (container_intersect(c1, type1, c2, type2))
                return true;
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(& x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(& x2->high_low_container, s1, pos2);
        }
    }
    return answer != 0;
}